

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O1

void wallify_vault(monst *grd)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  level *plVar4;
  char cVar5;
  schar sVar6;
  uint uVar7;
  uint uVar8;
  obj *otmp;
  trap *trap;
  char cVar9;
  long lVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  char cVar14;
  char cVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  monst *mtmp;
  int y;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  obj *in_stack_ffffffffffffff78;
  
  iVar19 = *(int *)((long)&grd[1].nmon + 4);
  cVar5 = level->rooms[iVar19].lx + -1;
  cVar9 = level->rooms[iVar19].hx + '\x01';
  if (cVar9 < cVar5) {
    bVar2 = false;
    bVar3 = false;
  }
  else {
    cVar14 = level->rooms[iVar19].ly + -1;
    lVar17 = (long)cVar14;
    cVar15 = level->rooms[iVar19].hy + '\x01';
    cVar11 = cVar14;
    if (cVar14 <= cVar15) {
      cVar11 = cVar15;
    }
    lVar10 = (long)cVar9;
    lVar20 = (long)cVar5;
    lVar18 = (long)cVar15;
    bVar3 = false;
    bVar2 = false;
    lVar21 = lVar20;
    do {
      if (cVar14 <= cVar15) {
        lVar22 = lVar17;
        do {
          if (((lVar22 == lVar18) || (lVar22 == lVar17 || (lVar21 == lVar10 || lVar21 == lVar20)))
             && (cVar5 = level->locations[lVar21][lVar22].typ, cVar5 == '\0' || '\f' < cVar5)) {
            iVar19 = *(int *)&grd->field_0x74;
            if (iVar19 < *(int *)&grd[1].nmon) {
              iVar12 = *(int *)&grd[1].nmon - iVar19;
              pcVar16 = (char *)((long)grd[1].mtrack + (long)iVar19 * 3 + -0x33);
              do {
                if ((lVar21 == pcVar16[-1]) && (lVar22 == *pcVar16)) goto LAB_0027fe1d;
                pcVar16 = pcVar16 + 3;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
            mtmp = level->monsters[lVar21][lVar22];
            if (mtmp == (monst *)0x0) {
              mtmp = (monst *)0x0;
            }
            else if ((mtmp->field_0x61 & 2) != 0) {
              mtmp = (monst *)0x0;
            }
            if (mtmp != grd && mtmp != (monst *)0x0) {
              if (mtmp->mtame != '\0') {
                yelp(mtmp);
              }
              rloc(level,mtmp,'\0');
            }
            iVar19 = (int)lVar21;
            iVar12 = (int)lVar22;
            otmp = gold_at(level,iVar19,iVar12);
            if (otmp != (obj *)0x0) {
              iVar13 = *(int *)((long)&grd[1].nmon + 4);
              remove_object(otmp);
              newsym((int)otmp->ox,(int)otmp->oy);
              cVar5 = level->rooms[iVar13].lx;
              uVar7 = mt_random();
              cVar9 = level->rooms[iVar13].ly;
              uVar8 = mt_random();
              iVar13 = (int)(char)(((byte)uVar7 & 1) + cVar5);
              y = (int)(char)(((byte)uVar8 & 1) + cVar9);
              place_object(otmp,level,iVar13,y);
              stackobj(in_stack_ffffffffffffff78);
              newsym(iVar13,y);
              bVar3 = true;
            }
            trap = t_at(level,iVar19,iVar12);
            if (trap != (trap *)0x0) {
              deltrap(level,trap);
            }
            plVar4 = level;
            if (lVar21 == lVar20) {
              sVar6 = (lVar22 == lVar18) * '\x04' + '\x01';
              if (lVar22 == lVar17) {
                sVar6 = '\x03';
              }
            }
            else {
              sVar6 = '\x02';
              if ((lVar21 == lVar10) &&
                 (sVar6 = (lVar22 == lVar18) * '\x05' + '\x01', lVar22 == lVar17)) {
                sVar6 = '\x04';
              }
            }
            level->locations[lVar21][lVar22].typ = sVar6;
            puVar1 = &plVar4->locations[lVar21][lVar22].field_0x6;
            *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
            cVar5 = viz_array[lVar22][lVar21];
            viz_array[lVar22][lVar21] = '\x03';
            newsym(iVar19,iVar12);
            viz_array[lVar22][lVar21] = cVar5;
            block_point(iVar19,iVar12);
            bVar2 = true;
          }
LAB_0027fe1d:
          bVar23 = lVar22 != cVar11;
          lVar22 = lVar22 + 1;
        } while (bVar23);
      }
      bVar23 = lVar21 != lVar10;
      lVar21 = lVar21 + 1;
    } while (bVar23);
  }
  if (bVar3 || bVar2) {
    iVar19 = *(int *)&grd->field_0x74;
    if (iVar19 < *(int *)&grd[1].nmon) {
      iVar12 = *(int *)&grd[1].nmon - iVar19;
      pcVar16 = (char *)((long)grd[1].mtrack + (long)iVar19 * 3 + -0x33);
      do {
        if ((pcVar16[-1] == grd->mx) && (*pcVar16 == grd->my)) goto LAB_0027fea5;
        pcVar16 = pcVar16 + 3;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    if ((viz_array[grd->my][grd->mx] & 2U) == 0) {
      You_hear("a distant chant.");
    }
    else {
LAB_0027fea5:
      pcVar16 = x_monnam(grd,0,(char *)0x0,1,'\0');
      pline("The %s whispers an incantation.",pcVar16);
    }
    if (bVar3) {
      pline("A mysterious force moves the gold into the vault.");
    }
    if (bVar2) {
      pline("The damaged vault\'s walls are magically restored!");
      return;
    }
  }
  return;
}

Assistant:

static void wallify_vault(struct monst *grd)
{
	int x, y, typ;
	int vlt = EGD(grd)->vroom;
	char tmp_viz;
	xchar lox = level->rooms[vlt].lx - 1, hix = level->rooms[vlt].hx + 1,
	      loy = level->rooms[vlt].ly - 1, hiy = level->rooms[vlt].hy + 1;
	struct monst *mon;
	struct obj *gold;
	struct trap *trap;
	boolean fixed = FALSE;
	boolean movedgold = FALSE;

	for (x = lox; x <= hix; x++)
	    for (y = loy; y <= hiy; y++) {
		/* if not on the room boundary, skip ahead */
		if (x != lox && x != hix && y != loy && y != hiy) continue;

		if (!IS_WALL(level->locations[x][y].typ) && !in_fcorridor(grd, x, y)) {
		    if ((mon = m_at(level, x, y)) != 0 && mon != grd) {
			if (mon->mtame) yelp(mon);
			rloc(level, mon, FALSE);
		    }
		    if ((gold = gold_at(level, x, y)) != 0) {
			move_gold(gold, EGD(grd)->vroom);
			movedgold = TRUE;
		    }
		    if ((trap = t_at(level, x, y)) != 0)
			deltrap(level, trap);
		    if (x == lox)
			typ = (y == loy) ? TLCORNER :
			      (y == hiy) ? BLCORNER : VWALL;
		    else if (x == hix)
			typ = (y == loy) ? TRCORNER :
			      (y == hiy) ? BRCORNER : VWALL;
		    else  /* not left or right side, must be top or bottom */
			typ = HWALL;
		    level->locations[x][y].typ = typ;
		    level->locations[x][y].doormask = 0;
		    /*
		     * hack: player knows walls are restored because of the
		     * message, below, so show this on the screen.
		     */
		    tmp_viz = viz_array[y][x];
		    viz_array[y][x] = IN_SIGHT|COULD_SEE;
		    newsym(x,y);
		    viz_array[y][x] = tmp_viz;
		    block_point(x,y);
		    fixed = TRUE;
		}
	    }

	if (movedgold || fixed) {
	    if (in_fcorridor(grd, grd->mx, grd->my) || cansee(grd->mx, grd->my))
		pline("The %s whispers an incantation.", g_monnam(grd));
	    else You_hear("a distant chant.");
	    if (movedgold)
		pline("A mysterious force moves the gold into the vault.");
	    if (fixed)
		pline("The damaged vault's walls are magically restored!");
	}
}